

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::(anonymous_namespace)::XformEvaluator::result_abi_cxx11_
          (expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,void *this)

{
  undefined1 auVar1 [16];
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict
  local_38;
  void *local_18;
  XformEvaluator *this_local;
  
  local_18 = this;
  this_local = (XformEvaluator *)__return_storage_ptr__;
  auVar1 = ::std::__cxx11::string::empty();
  if ((auVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    nonstd::expected_lite::make_unexpected<std::__cxx11::string_const&>
              (&local_38,(expected_lite *)this,auVar1._8_8_);
    nonstd::expected_lite::
    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (__return_storage_ptr__,&local_38);
    nonstd::expected_lite::
    unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_38);
  }
  else {
    nonstd::expected_lite::
    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<tinyusdz::value::matrix4d,_0>
              (__return_storage_ptr__,(value_type *)((long)this + 0x20));
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<value::matrix4d, std::string> result() const {
    if (err.empty()) {
      return m;
    }

    return nonstd::make_unexpected(err);
  }